

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O2

void nn_chunkref_init(nn_chunkref *self,size_t size)

{
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  
  if (size < 0x20) {
    (self->u).ref[0] = (uint8_t)size;
  }
  else {
    (self->u).ref[0] = 0xff;
    iVar1 = nn_chunk_alloc(size,0,(void **)((long)&self->u + 8));
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      puVar2 = (uint *)__errno_location();
      pcVar3 = nn_err_strerror(*puVar2);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/utils/chunkref.c"
              ,0x37);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return;
}

Assistant:

void nn_chunkref_init (struct nn_chunkref *self, size_t size)
{
    int rc;
    struct nn_chunkref_chunk *ch;

    if (size < NN_CHUNKREF_MAX) {
        self->u.ref [0] = (uint8_t) size;
        return;
    }

    ch = (struct nn_chunkref_chunk*) self;
    ch->tag = 0xff;
    rc = nn_chunk_alloc (size, 0, &ch->chunk);
    errno_assert (rc == 0);
}